

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_0::ArrayComparisonTest<const_double,_const_double>::ArrayComparisonTest
          (ArrayComparisonTest<const_double,_const_double> *this,initializer_list<const_double> left
          ,initializer_list<const_double> right,TestOrdering expectedResult)

{
  double *pdVar1;
  
  heapArray<double_const,double_const*>
            (&this->left,(kj *)left._M_array,(double *)((kj *)left._M_array + left._M_len * 8),
             right._M_array);
  pdVar1 = (double *)
           _::HeapArrayDisposer::allocateImpl
                     (8,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  *pdVar1 = *right._M_array;
  (this->right).ptr = pdVar1;
  (this->right).size_ = 1;
  (this->right).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  this->expectedResult = (TestOrdering)right._M_len;
  return;
}

Assistant:

ArrayComparisonTest(std::initializer_list<A> left, std::initializer_list<B> right, TestOrdering expectedResult) :
    left(heapArray(left)), right(heapArray(right)), expectedResult(expectedResult) {}